

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O2

XrResult ApiDumpLayerXrCreatePassthroughFB
                   (XrSession session,XrPassthroughCreateInfoFB *createInfo,
                   XrPassthroughFB *outPassthrough)

{
  long lVar1;
  bool bVar2;
  XrResult XVar3;
  iterator iVar4;
  iterator iVar5;
  mapped_type *ppXVar6;
  invalid_argument *this;
  XrGeneratedDispatchTable *gen_dispatch_table;
  XrSession session_local;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  contents;
  unique_lock<std::mutex> lock;
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_370;
  string local_358;
  string local_338;
  ostringstream oss_outPassthrough;
  uint auStack_300 [88];
  ostringstream oss_session;
  uint auStack_188 [88];
  
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  contents.
  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  session_local = session;
  std::unique_lock<std::mutex>::unique_lock
            ((unique_lock<std::mutex> *)&oss_session,&g_session_dispatch_mutex);
  iVar4 = std::
          _Hashtable<XrSession_T_*,_std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrSession_T_*>,_std::hash<XrSession_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&g_session_dispatch_map._M_h,&session_local);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    gen_dispatch_table = (XrGeneratedDispatchTable *)0x0;
  }
  else {
    gen_dispatch_table =
         *(XrGeneratedDispatchTable **)
          ((long)iVar4.
                 super__Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false>
                 ._M_cur + 0x10);
  }
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&oss_session);
  if (iVar4.
      super__Node_iterator_base<std::pair<XrSession_T_*const,_XrGeneratedDispatchTable_*>,_false>.
      _M_cur == (__node_type *)0x0) {
    XVar3 = XR_ERROR_VALIDATION_FAILURE;
  }
  else {
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[9],char_const(&)[22],char_const(&)[1]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [9])"XrResult",(char (*) [22])"xrCreatePassthroughFB",
               (char (*) [1])0x20fb54);
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_session);
    lVar1 = *(long *)((long)&_oss_session[-1].super___mutex_base._M_mutex + 0x10);
    *(uint *)((long)auStack_188 + lVar1) = *(uint *)((long)auStack_188 + lVar1) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_session);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[10],char_const(&)[8],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [10])"XrSession",(char (*) [8])"session",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               &oss_outPassthrough);
    std::__cxx11::string::~string((string *)&oss_outPassthrough);
    std::__cxx11::string::string((string *)&local_338,"createInfo",(allocator *)&oss_outPassthrough)
    ;
    std::__cxx11::string::string
              ((string *)&local_358,"const XrPassthroughCreateInfoFB*",(allocator *)&lock);
    bVar2 = ApiDumpOutputXrStruct
                      (gen_dispatch_table,createInfo,&local_338,&local_358,true,&contents);
    std::__cxx11::string::~string((string *)&local_358);
    std::__cxx11::string::~string((string *)&local_338);
    if (!bVar2) {
      this = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this,"Invalid Operation");
      __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss_outPassthrough);
    *(uint *)((long)auStack_300 + *(long *)(_oss_outPassthrough + -0x18)) =
         *(uint *)((long)auStack_300 + *(long *)(_oss_outPassthrough + -0x18)) & 0xffffffb5 | 8;
    std::ostream::_M_insert<void_const*>(&oss_outPassthrough);
    std::__cxx11::stringbuf::str();
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[17],char_const(&)[15],std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)&contents,(char (*) [17])"XrPassthroughFB*",(char (*) [15])"outPassthrough",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&lock);
    std::__cxx11::string::~string((string *)&lock);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector(&local_370,&contents);
    ApiDumpLayerRecordContent(&local_370);
    std::
    vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(&local_370);
    XVar3 = (*gen_dispatch_table->CreatePassthroughFB)(session_local,createInfo,outPassthrough);
    if ((outPassthrough != (XrPassthroughFB *)0x0) && (XVar3 == XR_SUCCESS)) {
      iVar5 = std::
              _Hashtable<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
              ::find(&g_passthroughfb_dispatch_map._M_h,outPassthrough);
      if (iVar5.
          super__Node_iterator_base<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_false>
          ._M_cur == (__node_type *)0x0) {
        std::unique_lock<std::mutex>::unique_lock(&lock,&g_passthroughfb_dispatch_mutex);
        ppXVar6 = std::__detail::
                  _Map_base<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                  ::operator[]((_Map_base<XrPassthroughFB_T_*,_std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>,_std::allocator<std::pair<XrPassthroughFB_T_*const,_XrGeneratedDispatchTable_*>_>,_std::__detail::_Select1st,_std::equal_to<XrPassthroughFB_T_*>,_std::hash<XrPassthroughFB_T_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                *)&g_passthroughfb_dispatch_map,outPassthrough);
        *ppXVar6 = gen_dispatch_table;
        std::unique_lock<std::mutex>::~unique_lock(&lock);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_outPassthrough);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&oss_session);
  }
  std::
  vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&contents);
  return XVar3;
}

Assistant:

XRAPI_ATTR XrResult XRAPI_CALL ApiDumpLayerXrCreatePassthroughFB(
    XrSession session,
    const XrPassthroughCreateInfoFB* createInfo,
    XrPassthroughFB* outPassthrough) {
    XrResult result = XR_SUCCESS;
    try {
        // Generate output for this command
        std::vector<std::tuple<std::string, std::string, std::string>> contents;
        XrGeneratedDispatchTable *gen_dispatch_table = nullptr;

        {
            std::unique_lock<std::mutex> mlock(g_session_dispatch_mutex);
            auto map_iter = g_session_dispatch_map.find(session);
            if (map_iter == g_session_dispatch_map.end()) {
                return XR_ERROR_VALIDATION_FAILURE;
            }
            gen_dispatch_table = map_iter->second;
        }

        contents.emplace_back("XrResult", "xrCreatePassthroughFB", "");
        std::ostringstream oss_session;
        oss_session << std::hex << reinterpret_cast<const void*>(session);
        contents.emplace_back("XrSession", "session", oss_session.str());
        if (!ApiDumpOutputXrStruct(gen_dispatch_table, createInfo, "createInfo", "const XrPassthroughCreateInfoFB*", true, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::ostringstream oss_outPassthrough;
        oss_outPassthrough << std::hex << reinterpret_cast<const void*>(outPassthrough);
        contents.emplace_back("XrPassthroughFB*", "outPassthrough", oss_outPassthrough.str());
        ApiDumpLayerRecordContent(contents);

        result = gen_dispatch_table->CreatePassthroughFB(session, createInfo, outPassthrough);
        if (XR_SUCCESS == result && nullptr != outPassthrough) {
            auto exists = g_passthroughfb_dispatch_map.find(*outPassthrough);
            if (exists == g_passthroughfb_dispatch_map.end()) {
                std::unique_lock<std::mutex> lock(g_passthroughfb_dispatch_mutex);
                g_passthroughfb_dispatch_map[*outPassthrough] = gen_dispatch_table;
            }
        }
    } catch (...) {
        return XR_ERROR_VALIDATION_FAILURE;
    }
    return result;
}